

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O1

int nni_copyin_ms(nni_duration *dp,void *v,size_t sz,nni_type t)

{
  int iVar1;
  
  iVar1 = 0x1e;
  if (t == NNI_TYPE_DURATION) {
    iVar1 = 3;
    if (-2 < *v) {
      iVar1 = 0;
      if (dp != (nni_duration *)0x0) {
        *dp = *v;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int
nni_copyin_ms(nni_duration *dp, const void *v, size_t sz, nni_type t)
{
	nni_duration dur;
	NNI_ARG_UNUSED(sz);

	if (t != NNI_TYPE_DURATION) {
		return (NNG_EBADTYPE);
	}
	dur = *(nng_duration *) v;

	if (dur < -1) {
		return (NNG_EINVAL);
	}
	if (dp != NULL) {
		*dp = dur;
	}
	return (0);
}